

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_pickupmessage_T_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *copyStr;
  bool bVar1;
  char *str;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AInventory *defaults_local;
  
  copyStr = params[1].s;
  bVar1 = DObject::IsKindOf((DObject *)info,PClassInventory::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassInventory))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0x789,
                  "void Handler_pickupmessage_T_Inventory(AInventory *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  FString::operator=((FString *)(info + 1),copyStr);
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY(pickupmessage, T, Inventory)
{
	PROP_STRING_PARM(str, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassInventory)));
	static_cast<PClassInventory *>(info)->PickupMessage = str;
}